

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswMan.c
# Opt level: O1

Csw_Man_t * Csw_ManStart(Aig_Man_t *pMan,int nCutsMax,int nLeafMax,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  uint uVar3;
  Csw_Man_t *__s;
  Aig_Man_t *pAVar4;
  int *__s_00;
  Aig_Obj_t **ppAVar5;
  Csw_Cut_t **ppCVar6;
  Aig_MmFixed_t *pAVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  size_t __size;
  int iVar13;
  
  if (nCutsMax < 2) {
    __assert_fail("nCutsMax >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x32,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  if (0x10 < nLeafMax) {
    __assert_fail("nLeafMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x33,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  __s = (Csw_Man_t *)malloc(0xa8);
  memset(__s,0,0xa8);
  __s->nCutsMax = nCutsMax;
  __s->nLeafMax = nLeafMax;
  __s->fVerbose = fVerbose;
  __s->pManAig = pMan;
  pAVar4 = Aig_ManStartFrom(pMan);
  __s->pManRes = pAVar4;
  if (pMan->nObjs[2] != pAVar4->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x3d,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  pVVar1 = pMan->vObjs;
  lVar12 = (long)pVVar1->nSize;
  __s_00 = (int *)malloc(lVar12 * 4);
  __s->pnRefs = __s_00;
  __size = lVar12 << 3;
  ppAVar5 = (Aig_Obj_t **)malloc(__size);
  __s->pEquiv = ppAVar5;
  ppCVar6 = (Csw_Cut_t **)malloc(__size);
  __s->pCuts = ppCVar6;
  memset(ppCVar6,0,__size);
  memset(__s_00,0,(long)pVVar1->nSize << 2);
  uVar2 = 1 << ((char)nLeafMax - 5U & 0x1f);
  if (nLeafMax < 6) {
    uVar2 = 1;
  }
  __s->nTruthWords = uVar2;
  iVar13 = (nLeafMax + uVar2) * 4 + 0x18;
  __s->nCutSize = iVar13;
  pAVar7 = Aig_MmFixedStart(iVar13 * nCutsMax,0x200);
  __s->pMemCuts = pAVar7;
  uVar9 = ((pMan->nObjs[6] + pMan->nObjs[5]) * nCutsMax) / 2 - 1;
  while( true ) {
    do {
      uVar10 = uVar9 + 1;
      uVar3 = uVar9 & 1;
      uVar9 = uVar10;
    } while (uVar3 != 0);
    if (uVar10 < 9) break;
    iVar13 = 5;
    while (uVar10 % (iVar13 - 2U) != 0) {
      uVar3 = iVar13 * iVar13;
      iVar13 = iVar13 + 2;
      if (uVar10 < uVar3) goto LAB_004e9cb5;
    }
  }
LAB_004e9cb5:
  __s->nTableSize = uVar10;
  ppCVar6 = (Csw_Cut_t **)malloc((long)(int)uVar10 << 3);
  __s->pTable = ppCVar6;
  memset(ppCVar6,0,(long)(int)uVar10 << 3);
  ppAVar5[pMan->pConst1->Id] = pAVar4->pConst1;
  pVVar1 = pMan->vCis;
  lVar12 = (long)pVVar1->nSize;
  if (0 < lVar12) {
    lVar11 = 0;
    do {
      if (pAVar4->vCis->nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppAVar5[*(int *)((long)pVVar1->pArray[lVar11] + 0x24)] =
           (Aig_Obj_t *)pAVar4->vCis->pArray[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar12 != lVar11);
  }
  puVar8 = (uint *)malloc((ulong)(uVar2 * 4) << 2);
  __s->puTemp[0] = puVar8;
  puVar8 = puVar8 + uVar2;
  __s->puTemp[1] = puVar8;
  __s->puTemp[2] = puVar8 + uVar2;
  __s->puTemp[3] = puVar8 + uVar2 + uVar2;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the cut sweeping manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Csw_Man_t * Csw_ManStart( Aig_Man_t * pMan, int nCutsMax, int nLeafMax, int fVerbose )
{
    Csw_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    assert( nCutsMax >= 2  );
    assert( nLeafMax <= 16 );
    // allocate the fraiging manager
    p = ABC_ALLOC( Csw_Man_t, 1 );
    memset( p, 0, sizeof(Csw_Man_t) );
    p->nCutsMax = nCutsMax;
    p->nLeafMax = nLeafMax;
    p->fVerbose = fVerbose;
    p->pManAig  = pMan;
    // create the new manager
    p->pManRes  = Aig_ManStartFrom( pMan );
    assert( Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes) );
    // allocate room for cuts and equivalent nodes
    p->pnRefs   = ABC_ALLOC( int, Aig_ManObjNumMax(pMan) );
    p->pEquiv   = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pMan) );
    p->pCuts    = ABC_ALLOC( Csw_Cut_t *, Aig_ManObjNumMax(pMan) );
    memset( p->pCuts, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(pMan) );
    memset( p->pnRefs, 0, sizeof(int) * Aig_ManObjNumMax(pMan) );
    // allocate memory manager
    p->nTruthWords = Abc_TruthWordNum(nLeafMax);
    p->nCutSize = sizeof(Csw_Cut_t) + sizeof(int) * nLeafMax + sizeof(unsigned) * p->nTruthWords;
    p->pMemCuts = Aig_MmFixedStart( p->nCutSize * p->nCutsMax, 512 );
    // allocate hash table for cuts
    p->nTableSize = Abc_PrimeCudd( Aig_ManNodeNum(pMan) * p->nCutsMax / 2 );
    p->pTable = ABC_ALLOC( Csw_Cut_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // set the pointers to the available fraig nodes
    Csw_ObjSetEquiv( p, Aig_ManConst1(p->pManAig), Aig_ManConst1(p->pManRes) );
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Csw_ObjSetEquiv( p, pObj, Aig_ManCi(p->pManRes, i) );
    // room for temporary truth tables
    p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
    p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
    p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
    p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    return p;
}